

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O1

void embree::avx::splitPrimitive<embree::avx::TriangleSplitter>
               (TriangleSplitter *splitter,PrimRef *prim,uint splitprims,SplittingGrid *grid,
               PrimRef *subPrims,uint *numSubPrims)

{
  PrimRef *pPVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  __m128 afVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  byte bVar10;
  long lVar11;
  float fVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  PrimRef left;
  PrimRef right;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_80;
  undefined1 local_70 [16];
  undefined1 auVar23 [64];
  undefined1 auVar26 [64];
  
  if (splitprims == 1) {
    uVar5 = *numSubPrims;
    *numSubPrims = uVar5 + 1;
    uVar7 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar8 = *(undefined8 *)&(prim->upper).field_0;
    uVar9 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    pPVar1 = subPrims + uVar5;
    *(undefined8 *)&(pPVar1->lower).field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&(pPVar1->lower).field_0 + 8) = uVar7;
    *(undefined8 *)&(pPVar1->upper).field_0 = uVar8;
    *(undefined8 *)((long)&(pPVar1->upper).field_0 + 8) = uVar9;
    return;
  }
  aVar2 = (prim->lower).field_0;
  aVar3 = (prim->upper).field_0;
  aVar4 = (grid->base).field_0;
  auVar22 = vsubps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar4);
  fVar12 = grid->scale;
  auVar18._0_4_ = auVar22._0_4_ * fVar12 + 0.2;
  auVar18._4_4_ = auVar22._4_4_ * fVar12 + 0.2;
  auVar18._8_4_ = auVar22._8_4_ * fVar12 + 0.2;
  auVar18._12_4_ = auVar22._12_4_ * fVar12 + 0.2;
  auVar22 = vsubps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar4);
  auVar28._0_4_ = auVar22._0_4_ * fVar12 + -0.2;
  auVar28._4_4_ = auVar22._4_4_ * fVar12 + -0.2;
  auVar28._8_4_ = auVar22._8_4_ * fVar12 + -0.2;
  auVar28._12_4_ = auVar22._12_4_ * fVar12 + -0.2;
  auVar22 = vroundps_avx(auVar18,1);
  auVar22 = vcvtps2dq_avx(auVar22);
  auVar25 = vroundps_avx(auVar28,1);
  auVar25 = vcvtps2dq_avx(auVar25);
  auVar18 = vcvtps2dq_avx(auVar18);
  auVar28 = vcvtps2dq_avx(auVar28);
  auVar18 = vpcmpgtd_avx(auVar28,auVar18);
  afVar6 = (__m128)vblendvps_avx(auVar22,auVar25,auVar18);
  local_a0.m128[0] = afVar6[0];
  local_a0.m128[1] = afVar6[1];
  local_a0.m128[2] = afVar6[2];
  local_a0.m128[3] = afVar6[3];
  auVar25 = vshufps_avx(auVar22,auVar22,0xe8);
  auVar18 = vpslld_avx(auVar25,0x10);
  auVar25 = vpor_avx(auVar18,auVar25);
  auVar19._8_4_ = 0x30000ff;
  auVar19._0_8_ = 0x30000ff030000ff;
  auVar19._12_4_ = 0x30000ff;
  auVar25 = vpand_avx(auVar25,auVar19);
  auVar18 = vpslld_avx(auVar25,8);
  auVar25 = vpor_avx(auVar25,auVar18);
  auVar21._8_4_ = 0x300f00f;
  auVar21._0_8_ = 0x300f00f0300f00f;
  auVar21._12_4_ = 0x300f00f;
  auVar25 = vpand_avx(auVar25,auVar21);
  auVar18 = vpslld_avx(auVar25,4);
  auVar25 = vpor_avx(auVar25,auVar18);
  auVar24._8_4_ = 0x30c30c3;
  auVar24._0_8_ = 0x30c30c3030c30c3;
  auVar24._12_4_ = 0x30c30c3;
  auVar25 = vpand_avx(auVar25,auVar24);
  auVar25 = vpmulld_avx(auVar25,_DAT_02028070);
  auVar25 = vpand_avx(auVar25,_DAT_02028080);
  local_a0._4_8_ = afVar6._4_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_a0._4_8_;
  auVar18 = vpslld_avx(auVar27,0x10);
  auVar18 = vpor_avx(auVar18,auVar27);
  auVar18 = vpand_avx(auVar18,auVar19);
  auVar28 = vpslld_avx(auVar18,8);
  auVar18 = vpor_avx(auVar28,auVar18);
  auVar18 = vpand_avx(auVar18,auVar21);
  auVar28 = vpslld_avx(auVar18,4);
  auVar18 = vpor_avx(auVar28,auVar18);
  auVar18 = vpand_avx(auVar18,auVar24);
  auVar18 = vpmulld_avx(auVar18,_DAT_02028090);
  auVar18 = vpand_avx(auVar18,_DAT_020280a0);
  auVar22 = vshufps_avx(auVar22,auVar22,0x55);
  local_a0.m128[0] = afVar6[0];
  auVar22 = vpinsrd_avx(auVar22,local_a0.m128[0],1);
  auVar28 = vpslld_avx(auVar22,0x10);
  auVar22 = vpor_avx(auVar28,auVar22);
  auVar22 = vpand_avx(auVar22,auVar19);
  auVar28 = vpslld_avx(auVar22,8);
  auVar22 = vpor_avx(auVar22,auVar28);
  auVar22 = vpand_avx(auVar22,auVar21);
  auVar28 = vpslld_avx(auVar22,4);
  auVar22 = vpor_avx(auVar22,auVar28);
  auVar22 = vpand_avx(auVar22,auVar24);
  auVar22 = vpmulld_avx(auVar22,_DAT_020280b0);
  auVar22 = vpand_avx(auVar22,_DAT_020280c0);
  auVar28 = vpunpckldq_avx(auVar25,auVar18);
  auVar25 = vpshufd_avx(auVar25,0x55);
  auVar25 = vpblendw_avx(auVar25,auVar18,0xc);
  auVar25 = vpor_avx(auVar28,auVar25);
  auVar22 = vpor_avx(auVar25,auVar22);
  fVar15 = auVar22._0_4_;
  fVar12 = auVar22._4_4_;
  if (fVar15 == fVar12) {
    uVar13 = 0;
    fVar16 = fVar15;
  }
  else {
    uVar5 = 0x1f;
    if (((uint)fVar12 ^ (uint)fVar15) != 0) {
      for (; ((uint)fVar12 ^ (uint)fVar15) >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar13 = (ulong)(uVar5 % 3);
    uVar14 = (ulong)(uVar5 % 3 << 2);
    bVar10 = (byte)(uVar5 / 3);
    fVar16 = (float)((*(uint *)((long)&local_a0 + uVar14) >> (bVar10 & 0x1f)) << (bVar10 & 0x1f)) *
             0.0009765625 * grid->extend + *(float *)((long)&(grid->base).field_0 + uVar14);
  }
  if (fVar15 == fVar12) {
    uVar5 = *numSubPrims;
    *numSubPrims = uVar5 + 1;
    uVar7 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar8 = *(undefined8 *)&(prim->upper).field_0;
    uVar9 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    pPVar1 = subPrims + uVar5;
    *(undefined8 *)&(pPVar1->lower).field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&(pPVar1->lower).field_0 + 8) = uVar7;
    *(undefined8 *)&(pPVar1->upper).field_0 = uVar8;
    *(undefined8 *)((long)&(pPVar1->upper).field_0 + 8) = uVar9;
  }
  else {
    auVar22._8_4_ = 0x7f800000;
    auVar22._0_8_ = 0x7f8000007f800000;
    auVar22._12_4_ = 0x7f800000;
    auVar23 = ZEXT1664(auVar22);
    auVar25._8_4_ = 0xff800000;
    auVar25._0_8_ = 0xff800000ff800000;
    auVar25._12_4_ = 0xff800000;
    auVar26 = ZEXT1664(auVar25);
    lVar11 = 0;
    auVar17 = ZEXT1664(auVar25);
    auVar20 = ZEXT1664(auVar22);
    do {
      fVar12 = *(float *)((long)&splitter->v[0].field_0 + lVar11 + uVar13 * 4);
      if (fVar12 <= fVar16) {
        auVar22 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar11);
        auVar25 = vminps_avx(auVar23._0_16_,auVar22);
        auVar23 = ZEXT1664(auVar25);
        auVar22 = vmaxps_avx(auVar26._0_16_,auVar22);
        auVar26 = ZEXT1664(auVar22);
      }
      if (fVar16 <= fVar12) {
        auVar22 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar11);
        auVar25 = vminps_avx(auVar20._0_16_,auVar22);
        auVar20 = ZEXT1664(auVar25);
        auVar22 = vmaxps_avx(auVar17._0_16_,auVar22);
        auVar17 = ZEXT1664(auVar22);
      }
      fVar15 = *(float *)((long)&splitter->v[1].field_0 + lVar11 + uVar13 * 4);
      if (((fVar12 < fVar16) && (fVar16 < fVar15)) || ((fVar16 < fVar12 && (fVar15 < fVar16)))) {
        auVar22 = ZEXT416((uint)((fVar16 - fVar12) * (1.0 / (fVar15 - fVar12))));
        auVar25 = vshufps_avx(auVar22,auVar22,0);
        auVar22 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar11);
        auVar18 = vsubps_avx(*(undefined1 (*) [16])((long)&splitter->v[1].field_0 + lVar11),auVar22)
        ;
        auVar29._0_4_ = auVar22._0_4_ + auVar25._0_4_ * auVar18._0_4_;
        auVar29._4_4_ = auVar22._4_4_ + auVar25._4_4_ * auVar18._4_4_;
        auVar29._8_4_ = auVar22._8_4_ + auVar25._8_4_ * auVar18._8_4_;
        auVar29._12_4_ = auVar22._12_4_ + auVar25._12_4_ * auVar18._12_4_;
        auVar22 = vminps_avx(auVar23._0_16_,auVar29);
        auVar23 = ZEXT1664(auVar22);
        auVar22 = vmaxps_avx(auVar26._0_16_,auVar29);
        auVar26 = ZEXT1664(auVar22);
        auVar22 = vminps_avx(auVar20._0_16_,auVar29);
        auVar20 = ZEXT1664(auVar22);
        auVar22 = vmaxps_avx(auVar17._0_16_,auVar29);
        auVar17 = ZEXT1664(auVar22);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x30);
    auVar22 = vmaxps_avx(auVar23._0_16_,(undefined1  [16])aVar2);
    auVar25 = vminps_avx(auVar26._0_16_,(undefined1  [16])aVar3);
    auVar18 = ZEXT416((uint)(prim->lower).field_0.m128[3]);
    local_a0 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar22,auVar18,0x30);
    auVar28 = ZEXT416((uint)(prim->upper).field_0.m128[3]);
    local_90 = vinsertps_avx(auVar25,auVar28,0x30);
    auVar22 = vmaxps_avx(auVar20._0_16_,(undefined1  [16])aVar2);
    auVar25 = vminps_avx(auVar17._0_16_,(undefined1  [16])aVar3);
    local_80 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar22,auVar18,0x30);
    local_70 = vinsertps_avx(auVar25,auVar28,0x30);
    splitPrimitive<embree::avx::TriangleSplitter>
              (splitter,(PrimRef *)&local_a0.field_1,splitprims >> 1,grid,subPrims,numSubPrims);
    splitPrimitive<embree::avx::TriangleSplitter>
              (splitter,(PrimRef *)&local_80.field_1,splitprims - (splitprims >> 1),grid,subPrims,
               numSubPrims);
  }
  return;
}

Assistant:

void splitPrimitive(const Splitter& splitter,
                          const PrimRef& prim,
                          const unsigned int splitprims,
                          const SplittingGrid& grid,
                          PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                          unsigned int& numSubPrims)
    {
      assert(splitprims > 0 && splitprims <= MAX_PRESPLITS_PER_PRIMITIVE);
      
      if (splitprims == 1)
      {
        assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
        subPrims[numSubPrims++] = prim;
      }
      else
      {
        unsigned int dim; float fsplit;
        if (!grid.split_pos(prim, dim, fsplit))
        {
          assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
          subPrims[numSubPrims++] = prim;
          return;
        }
          
        /* split primitive */
        PrimRef left,right;
        splitter(prim,dim,fsplit,left,right);
        assert(!left.bounds().empty());
        assert(!right.bounds().empty());

        const unsigned int splitprims_left = splitprims/2;
        const unsigned int splitprims_right = splitprims - splitprims_left;
        splitPrimitive(splitter,left,splitprims_left,grid,subPrims,numSubPrims);
        splitPrimitive(splitter,right,splitprims_right,grid,subPrims,numSubPrims);
      }
    }